

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.h
# Opt level: O0

__m128 glmm_vdots(__m128 a,__m128 b)

{
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  __m128 afVar1;
  __m128 afVar2;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  
  afVar1[3] = in_XMM0_Db;
  afVar1[2] = in_XMM0_Da;
  afVar1[0] = in_XMM0_Da * in_XMM1_Da;
  afVar1[1] = in_XMM0_Db * in_XMM1_Db;
  afVar1 = glmm_vhadds(afVar1);
  afVar2[0] = afVar1[0];
  auVar3._4_4_ = afVar1[1];
  register0x00001240 = afVar1[2];
  register0x00001244 = afVar1[3];
  return afVar2;
}

Assistant:

static inline
__m128
glmm_vdots(__m128 a, __m128 b) {
#if (defined(__SSE4_1__) || defined(__SSE4_2__)) && defined(CGLM_SSE4_DOT)
  return _mm_dp_ps(a, b, 0xFF);
#elif defined(__SSE3__) && defined(CGLM_SSE3_DOT)
  __m128 x0, x1;
  x0 = _mm_mul_ps(a, b);
  x1 = _mm_hadd_ps(x0, x0);
  return _mm_hadd_ps(x1, x1);
#else
  return glmm_vhadds(_mm_mul_ps(a, b));
#endif
}